

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O1

bool __thiscall
MapLoader::validateBordersLine
          (MapLoader *this,vector<int,_std::allocator<int>_> *lineNums,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *lineWords,int *lineCount,bool *validMap,int *countryCount,bool verbose)

{
  pointer pbVar1;
  iterator __position;
  ostream *poVar2;
  pointer pbVar3;
  bool bVar4;
  int x;
  stringstream parser;
  int local_1cc;
  bool *local_1c8;
  int *local_1c0;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  pbVar3 = (lineWords->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (lineWords->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)pbVar1 - (long)pbVar3) < 0x21) {
    if (verbose) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Line ",5);
      poVar2 = (ostream *)std::ostream::operator<<(&std::cout,*lineCount);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,
                 " - [ERROR] : a line in the borders declaration had missing tokens, map could not be created.\n"
                 ,0x5d);
    }
    *validMap = false;
    bVar4 = false;
  }
  else {
    bVar4 = pbVar3 == pbVar1;
    if (!bVar4) {
      local_1c8 = validMap;
      local_1c0 = lineCount;
      do {
        std::__cxx11::stringstream::stringstream(local_1b8,(string *)pbVar3,_S_out|_S_in);
        local_1cc = 0;
        std::istream::operator>>((istream *)local_1b8,&local_1cc);
        __position._M_current =
             (lineNums->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (lineNums->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)lineNums,__position,&local_1cc);
        }
        else {
          *__position._M_current = local_1cc;
          (lineNums->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = __position._M_current + 1;
        }
        if (*countryCount < local_1cc) {
          if (verbose) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Line ",5);
            poVar2 = (ostream *)std::ostream::operator<<(&std::cout,*local_1c0);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar2," - [ERROR] : a country or continent ID did was invalid.\n",0x38);
          }
          *local_1c8 = false;
          std::__cxx11::stringstream::~stringstream(local_1b8);
          std::ios_base::~ios_base(local_138);
          return bVar4;
        }
        std::__cxx11::stringstream::~stringstream(local_1b8);
        std::ios_base::~ios_base(local_138);
        pbVar3 = pbVar3 + 1;
        bVar4 = pbVar3 == pbVar1;
      } while (!bVar4);
    }
  }
  return bVar4;
}

Assistant:

bool MapLoader::validateBordersLine(std::vector<int>* lineNums, std::vector<std::string>* lineWords, const int* lineCount,
                               bool* validMap, const int* countryCount, bool verbose) {
    //check validity of the line in this mode
    if (lineWords->size() < 2) {
        if(verbose){
            std::cout << "Line " << *lineCount
                      << " - [ERROR] : a line in the borders declaration had missing tokens, map could not be created.\n";
        }
        *validMap = false;
        return false;
    } else {
        //convert strings to ints
        for (auto& s : *lineWords) {
            std::stringstream parser(s);
            int x = 0;
            parser >> x;
            lineNums->push_back(x);
            //check that all countries referenced in this line exist
            if (x > *countryCount) {
                if(verbose){
                    std::cout << "Line " << *lineCount << " - [ERROR] : a country or continent ID did was invalid.\n";
                }
                *validMap = false;
                return false;
            }
        }
        return true;
    }
}